

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O0

int Lodtalk::identityHashOf(Oop obj)

{
  bool bVar1;
  SmallIntegerValue SVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 local_18;
  Oop obj_local;
  
  local_18 = obj.field_0;
  bVar1 = Oop::isSmallInteger((Oop *)&local_18);
  if (bVar1) {
    SVar2 = Oop::decodeSmallInteger((Oop *)&local_18);
    obj_local.field_0.uintValue._4_4_ = (undefined4)SVar2;
  }
  else {
    bVar1 = Oop::isCharacter((Oop *)&local_18);
    if (bVar1) {
      obj_local.field_0.intValue._4_4_ = Oop::decodeCharacter((Oop *)&local_18);
    }
    else {
      bVar1 = Oop::isSmallFloat((Oop *)&local_18);
      if (bVar1) {
        obj_local.field_0.uintValue._4_4_ = (undefined4)(local_18.uintValue >> 3);
      }
      else {
        obj_local.field_0.uintValue._4_4_ = (uint)((ulong)*local_18.header >> 10) & 0x3fffff;
      }
    }
  }
  return obj_local.field_0.intValue._4_4_;
}

Assistant:

inline int identityHashOf(Oop obj)
{
	if(obj.isSmallInteger())
		return (int)obj.decodeSmallInteger();
    else if (obj.isCharacter())
        return obj.decodeCharacter();
    else if (obj.isSmallFloat())
        return int(obj.uintValue >> ObjectTag::SmallFloatShift);
	return obj.header->identityHash;
}